

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testPipelineQueryPrograms
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Pipeline *pPVar2;
  GLint GVar3;
  _Alloc_hider _Var4;
  GLenum GVar5;
  int iVar6;
  ProgramWrapper *pPVar7;
  GLint queryFrg;
  GLint queryVtx;
  ProgramParams pipePp;
  GLint local_6c;
  string local_68;
  GLuint local_48;
  GLint local_44;
  ProgramParams local_40;
  
  local_40 = genProgramParams(&this->m_rnd);
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)&local_68,this,&local_40);
  _Var4._M_p = local_68._M_dataplus._M_p;
  local_68._M_dataplus._M_p = (pointer)0x0;
  if ((pipeOut->
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
      ).m_data.ptr != (Pipeline *)_Var4._M_p) {
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
    ::reset(&pipeOut->
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           );
    (pipeOut->
    super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
    ).m_data.ptr = (Pipeline *)_Var4._M_p;
  }
  pPVar2 = (pipeOut->
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           ).m_data.ptr;
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::reset((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           *)&local_68);
  local_48 = *(GLuint *)
              ((long)(pPVar2->pipeline).
                     super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                     .m_data.ptr + 8);
  local_44 = 0;
  local_6c = 0;
  this_00 = &this->super_CallLogWrapper;
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glGetProgramPipelineiv(this_00,local_48,0x8b31,&local_44);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glGetProgramPipelineiv(pipeName, GL_VERTEX_SHADER, &queryVtx)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x5b9);
  GVar3 = local_44;
  (this->super_CallLogWrapper).m_enableLog = false;
  pPVar7 = (pPVar2->vtxProg).
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  if (pPVar7 == (ProgramWrapper *)0x0) {
    pPVar7 = (pPVar2->fullProg).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
  }
  iVar6 = (*pPVar7->_vptr_ProgramWrapper[2])();
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Program pipeline query reported wrong vertex shader program","");
  tcu::ResultCollector::check(&this->m_status,GVar3 == iVar6,&local_68);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  (this->super_CallLogWrapper).m_enableLog = true;
  glu::CallLogWrapper::glGetProgramPipelineiv(this_00,local_48,0x8b30,&local_6c);
  GVar5 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar5,"glGetProgramPipelineiv(pipeName, GL_FRAGMENT_SHADER, &queryFrg)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSeparateShaderTests.cpp"
                  ,0x5bd);
  GVar3 = local_6c;
  (this->super_CallLogWrapper).m_enableLog = false;
  pPVar7 = (pPVar2->frgProg).
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
           .m_data.ptr;
  if (pPVar7 == (ProgramWrapper *)0x0) {
    pPVar7 = (pPVar2->fullProg).
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
             .m_data.ptr;
  }
  iVar6 = (*pPVar7->_vptr_ProgramWrapper[2])();
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"Program pipeline query reported wrong fragment shader program","")
  ;
  tcu::ResultCollector::check(&this->m_status,GVar3 == iVar6,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SeparateShaderTest::testPipelineQueryPrograms (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pipePp		= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pipePp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	GLint						queryVtx	= 0;
	GLint						queryFrg	= 0;

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_VERTEX_SHADER, &queryVtx)));
	m_status.check(GLuint(queryVtx) == pipeline.getVertexProgram().getProgramName(),
				   "Program pipeline query reported wrong vertex shader program");

	LOG_CALL(GLU_CHECK_CALL(glGetProgramPipelineiv(pipeName, GL_FRAGMENT_SHADER, &queryFrg)));
	m_status.check(GLuint(queryFrg) == pipeline.getFragmentProgram().getProgramName(),
				   "Program pipeline query reported wrong fragment shader program");
}